

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::operator==
          (PerfEventConfig_CallstackSampling *this,PerfEventConfig_CallstackSampling *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (((_Var1) && (bVar2 = protozero::operator==(&this->scope_,&other->scope_), bVar2)) &&
     (this->kernel_frames_ == other->kernel_frames_)) {
    return this->user_frames_ == other->user_frames_;
  }
  return false;
}

Assistant:

bool PerfEventConfig_CallstackSampling::operator==(const PerfEventConfig_CallstackSampling& other) const {
  return unknown_fields_ == other.unknown_fields_
   && scope_ == other.scope_
   && kernel_frames_ == other.kernel_frames_
   && user_frames_ == other.user_frames_;
}